

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuResource.cpp
# Opt level: O2

Resource * __thiscall tcu::ResourcePrefix::getResource(ResourcePrefix *this,char *name)

{
  Archive *pAVar1;
  int iVar2;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  pAVar1 = this->m_archive;
  std::operator+(&local_30,&this->m_prefix,name);
  iVar2 = (*pAVar1->_vptr_Archive[2])(pAVar1,local_30._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_30);
  return (Resource *)CONCAT44(extraout_var,iVar2);
}

Assistant:

Resource* ResourcePrefix::getResource (const char* name) const
{
	return m_archive.getResource((m_prefix + name).c_str());
}